

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qscopedpointer.h
# Opt level: O2

QSize __thiscall QAbstractScrollArea::sizeHint(QAbstractScrollArea *this)

{
  short sVar1;
  long lVar2;
  int iVar3;
  bool bVar4;
  int iVar5;
  int extraout_var;
  undefined8 uVar6;
  QSize QVar7;
  int iVar8;
  bool bVar9;
  bool bVar10;
  
  lVar2 = *(long *)(this + 8);
  if (*(int *)(lVar2 + 0x2ac) == 0) {
    QVar7.wd.m_i = 0x100;
    QVar7.ht.m_i = 0xc0;
  }
  else if (((*(int *)(lVar2 + 0x2ac) == 2) || (*(int *)(lVar2 + 0x2a4) < 0)) ||
          (*(int *)(lVar2 + 0x2a8) < 0)) {
    sVar1 = *(short *)(lVar2 + 0x26c);
    bVar4 = QWidget::isVisibleTo(*(QWidget **)(lVar2 + 0x290),(QWidget *)this);
    bVar10 = true;
    bVar9 = true;
    if (bVar4) {
      bVar9 = *(int *)(lVar2 + 0x298) == 1;
    }
    bVar4 = QWidget::isVisibleTo(*(QWidget **)(lVar2 + 0x288),(QWidget *)this);
    if (bVar4) {
      bVar10 = *(int *)(lVar2 + 0x29c) == 1;
    }
    iVar8 = 0;
    iVar5 = 0;
    if (!bVar9) {
      iVar5 = (**(code **)(**(long **)(lVar2 + 0x290) + 0x70))();
    }
    iVar3 = sVar1 * 2;
    if (!bVar10) {
      (**(code **)(**(long **)(lVar2 + 0x288) + 0x70))();
      iVar8 = extraout_var;
    }
    uVar6 = (**(code **)(*(long *)this + 0x1c0))(this);
    QVar7.wd.m_i = (int)uVar6 + iVar5 + iVar3;
    QVar7.ht.m_i = (int)((ulong)uVar6 >> 0x20) + iVar8 + iVar3;
    *(QSize *)(lVar2 + 0x2a4) = QVar7;
  }
  else {
    QVar7 = *(QSize *)(lVar2 + 0x2a4);
  }
  return QVar7;
}

Assistant:

T *get() const noexcept
    {
        return d;
    }